

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O2

bool __thiscall GenCADFile::parse_dimension_units(GenCADFile *this,mpc_ast_t *header_ast)

{
  mpc_ast_t **ppmVar1;
  Dimension DVar2;
  bool bVar3;
  int iVar4;
  GenCADFile *this_00;
  mpc_ast_t *pmVar5;
  GenCADFile *this_01;
  
  this_00 = (GenCADFile *)mpc_ast_get_child(header_ast,"units|>");
  this->m_dimension = INVALID;
  if ((this_00 == (GenCADFile *)0x0) ||
     (*(int *)&(this_00->super_BRDFileBase).outline_segments.
               super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 4)) {
    return false;
  }
  this_01 = this_00;
  pmVar5 = mpc_ast_get_child((mpc_ast_t *)this_00,"unit|dimension|string");
  if (pmVar5 != (mpc_ast_t *)0x0) {
    bVar3 = has_text_content(this_01,pmVar5,"INCH");
    if (bVar3) {
      this->m_dimension = INCH;
      return true;
    }
    bVar3 = has_text_content(this_01,pmVar5,"THOU");
    if (bVar3) {
      this->m_dimension = THOU;
      return true;
    }
    bVar3 = has_text_content(this_01,pmVar5,"MM");
    if (bVar3) {
      this->m_dimension = MM;
      return true;
    }
    bVar3 = has_text_content(this_01,pmVar5,"MM100");
    if (bVar3) {
      this->m_dimension = MM100;
      return true;
    }
    return true;
  }
  pmVar5 = mpc_ast_get_child((mpc_ast_t *)this_00,"unit|dimension|>");
  if (pmVar5->children_num != 3) {
    return false;
  }
  ppmVar1 = pmVar5->children;
  pmVar5 = *ppmVar1;
  bVar3 = has_text_content(this_00,pmVar5,"USER");
  if (bVar3) {
    DVar2 = USER;
  }
  else {
    bVar3 = has_text_content(this_00,pmVar5,"USERM");
    if (bVar3) {
      DVar2 = USERCM;
    }
    else {
      bVar3 = has_text_content(this_00,pmVar5,"USERMM");
      if (!bVar3) {
        if (this->m_dimension == INVALID) {
          return false;
        }
        goto LAB_00136549;
      }
      DVar2 = USERMM;
    }
  }
  this->m_dimension = DVar2;
LAB_00136549:
  iVar4 = atoi(ppmVar1[2]->contents);
  this->m_dimension_unit = iVar4;
  return true;
}

Assistant:

bool GenCADFile::parse_dimension_units(mpc_ast_t *header_ast) {
	mpc_ast_t *units = mpc_ast_get_child(header_ast, "units|>");
	m_dimension      = INVALID;
	if (!units) return false;

	if (units->children_num == 4) {
		// Try UNITS <unit> format
		mpc_ast_t *unit = mpc_ast_get_child(units, "unit|dimension|string");
		if (unit) {
			if (has_text_content(unit, "INCH")) {
				m_dimension = INCH;
			} else if (has_text_content(unit, "THOU")) {
				m_dimension = THOU;
			} else if (has_text_content(unit, "MM")) {
				m_dimension = MM;
			} else if (has_text_content(unit, "MM100")) {
				m_dimension = MM100;
			}
			return true;
		}

		// UNITS <unit> does not match -> try UNITS <unit> <dimension_unit>
		unit = mpc_ast_get_child(units, "unit|dimension|>");
		if (unit->children_num == 3) {
			mpc_ast_t *start_child = unit->children[0];
			if (has_text_content(start_child, "USER")) {
				m_dimension = USER;
			} else if (has_text_content(start_child, "USERM")) {
				m_dimension = USERCM;
			} else if (has_text_content(start_child, "USERMM")) {
				m_dimension = USERMM;
			}

			if (m_dimension != INVALID) {
				m_dimension_unit = atoi(unit->children[2]->contents);
				return true;
			}
		}
	}

	return false;
}